

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O3

void __thiscall CFG::eliminateEpsilonProductions(CFG *this)

{
  pointer pcVar1;
  pointer pbVar2;
  pointer pbVar3;
  int iVar4;
  ostream *poVar5;
  pointer ppPVar6;
  pointer ppPVar7;
  pointer pbVar8;
  char *this_00;
  pointer __src;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  string symbol;
  string local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  pointer local_58;
  string local_50;
  
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  expandNullableSymbols(this,&local_78);
  this_00 = "Nullable symbols: ";
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Nullable symbols: ",0x12);
  vecToStr(&local_98,(CFG *)this_00,&local_78);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_98._M_dataplus._M_p,local_98._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_58 = local_78.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar8 = local_78.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      pcVar1 = (pbVar8->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_98,pcVar1,pcVar1 + pbVar8->_M_string_length);
      ppPVar6 = (this->productionsP).super__Vector_base<Production_*,_std::allocator<Production_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppPVar7 = (this->productionsP).super__Vector_base<Production_*,_std::allocator<Production_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      uVar10 = (uint)((ulong)((long)ppPVar7 - (long)ppPVar6) >> 3);
      if (0 < (int)uVar10) {
        uVar9 = 0;
        do {
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,local_98._M_dataplus._M_p,
                     local_98._M_dataplus._M_p + local_98._M_string_length);
          removeNullableSymbol
                    (this,&local_50,
                     (this->productionsP).
                     super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar9]);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          uVar9 = uVar9 + 1;
        } while ((uVar10 & 0x7fffffff) != uVar9);
        ppPVar6 = (this->productionsP).
                  super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppPVar7 = (this->productionsP).
                  super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      if (ppPVar7 != ppPVar6) {
        uVar9 = 0;
        iVar11 = 0;
        do {
          pbVar2 = (ppPVar6[uVar9]->toP).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pbVar3 = (ppPVar6[uVar9]->toP).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (pbVar2 == pbVar3) {
LAB_00115789:
            __src = ppPVar6 + uVar9 + 1;
            if (__src != ppPVar7) {
              memmove(ppPVar6 + uVar9,__src,(long)ppPVar7 - (long)__src);
              ppPVar6 = (this->productionsP).
                        super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
                        super__Vector_impl_data._M_start;
              ppPVar7 = (this->productionsP).
                        super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            }
            ppPVar7 = ppPVar7 + -1;
            (this->productionsP).super__Vector_base<Production_*,_std::allocator<Production_*>_>.
            _M_impl.super__Vector_impl_data._M_finish = ppPVar7;
            iVar11 = iVar11 + -1;
          }
          else if ((long)pbVar3 - (long)pbVar2 == 0x20) {
            iVar4 = std::__cxx11::string::compare((char *)pbVar2);
            ppPVar6 = (this->productionsP).
                      super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
            ppPVar7 = (this->productionsP).
                      super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            if (iVar4 == 0) goto LAB_00115789;
          }
          iVar11 = iVar11 + 1;
          uVar9 = (ulong)iVar11;
        } while (uVar9 < (ulong)((long)ppPVar7 - (long)ppPVar6 >> 3));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      pbVar8 = pbVar8 + 1;
    } while (pbVar8 != local_58);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  return;
}

Assistant:

void CFG::eliminateEpsilonProductions() {
    std::vector<std::string> nullableSymbols = {};
    while (expandNullableSymbols(nullableSymbols)) {}

    std::cout << "Nullable symbols: " << vecToStr(nullableSymbols) << std::endl;

    for (std::string symbol: nullableSymbols) {
        int pSize = productionsP.size();
        for (int i = 0; i < pSize; ++i) {
            removeNullableSymbol(symbol, productionsP[i]);
        }

        for (int i = 0; i < productionsP.size(); ++i) {
            if (productionsP[i]->getToP().empty() or
                (productionsP[i]->getToP().size() == 1 and
                 productionsP[i]->getToP()[0] == "e")) {
                // Transition A -> e
                productionsP.erase(productionsP.begin() + i);
                i--;
            }
        }
    }
}